

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void __thiscall mjs::global_object_impl::popuplate_global(global_object_impl *this)

{
  uint32_t *puVar1;
  bool bVar2;
  version vVar3;
  value_type vVar4;
  property_attribute pVar5;
  gc_heap *pgVar6;
  object_ptr *poVar7;
  object *poVar8;
  gc_heap_ptr<mjs::gc_string> *name;
  undefined1 auVar9 [16];
  value local_5d0;
  string local_5a8;
  gc_heap_ptr<mjs::object> local_598;
  value local_588;
  string local_560;
  gc_heap_ptr<mjs::object> local_550;
  value local_540;
  string local_518;
  gc_heap_ptr<mjs::object> local_508;
  value local_4f8;
  gc_heap_ptr<mjs::object> local_4d0;
  value local_4c0;
  gc_heap_ptr<mjs::object> local_498;
  gc_heap_ptr_untracked<mjs::object,_true> local_484;
  string local_480;
  anon_class_16_1_570cf4e1_for_f local_470;
  undefined1 local_460 [8];
  gc_heap_ptr<mjs::function_object> throw_func;
  anon_class_8_1_89917c4a put_string_function;
  gc_heap_ptr<mjs::object> local_440;
  anon_class_1_0_00000001_for_f local_429;
  gc_heap_ptr<mjs::object> local_428;
  anon_class_1_0_00000001_for_f local_411;
  gc_heap_ptr<mjs::object> local_410;
  anon_class_16_2_fa5da7e4_for_f local_400;
  gc_heap_ptr<mjs::object> local_3f0;
  value local_3e0;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  string local_3a8;
  value local_398;
  basic_string_view<char,_std::char_traits<char>_> local_370;
  string local_360;
  value local_350;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  string local_318;
  property_attribute local_304;
  undefined1 local_300 [4];
  property_attribute global_const_attrs;
  gc_heap_ptr<mjs::global_object> self;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2e0;
  value local_2d0;
  gc_heap_ptr_untracked<mjs::object,_true> local_2a4;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2a0;
  undefined1 local_290 [8];
  value prototype;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  value eo;
  wostringstream woss;
  native_error_type local_94;
  global_object_impl *pgStack_90;
  uint32_t i;
  anon_class_8_1_8991fb9c add;
  string local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  _Any_data local_38;
  object local_28;
  global_object_impl *this_local;
  
  local_28._24_8_ = this;
  object::prototype(&local_28);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked
            (&local_28.prototype_,(gc_heap_ptr<mjs::object> *)&local_28);
  (this->object_prototype_).pos_ = local_28.prototype_.pos_;
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&local_28);
  pgVar6 = object::heap((object *)this);
  self_ptr((global_object_impl *)local_68);
  (*(this->super_global_object).super_object._vptr_object[0x13])(&local_78,this,"Function");
  (*(this->super_global_object).super_object._vptr_object[0xb])(&add);
  gc_heap::
  make<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>,mjs::string,mjs::gc_heap_ptr<mjs::object>>
            ((gc_heap *)local_58,(gc_heap_ptr<mjs::global_object> *)pgVar6,(string *)local_68,
             (gc_heap_ptr<mjs::object> *)&local_78);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)(local_58 + 0x10),
             (gc_heap_ptr<mjs::function_object> *)local_58);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked
            ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_38,
             (gc_heap_ptr<mjs::object> *)(local_58 + 0x10));
  (this->function_prototype_).pos_ = local_38._0_4_;
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_58 + 0x10));
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_58);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&add);
  string::~string(&local_78);
  gc_heap_ptr<mjs::global_object>::~gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_68);
  pgStack_90 = this;
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Object",make_object_object,&this->object_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Function",make_function_object,&this->function_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Array",make_array_object,&this->array_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"String",make_string_object,&this->string_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Boolean",make_boolean_object,&this->boolean_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Number",make_number_object,&this->number_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Math",anon_unknown_35::make_math_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"Date",make_date_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &stack0xffffffffffffff70,"console",anon_unknown_35::make_console_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  if (1 < (int)(this->super_global_object).version_) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &stack0xffffffffffffff70,"JSON",make_json_object,
                 (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  }
  vVar3 = global_object::language_version(&this->super_global_object);
  if (0 < (int)vVar3) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &stack0xffffffffffffff70,"RegExp",make_regexp_object,&this->regexp_prototype_);
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &stack0xffffffffffffff70,"Error",make_error_object,
                 (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
    for (local_94 = generic; local_94 < 8; local_94 = local_94 + eval) {
      if (*(native_error_type *)(native_error_types + (ulong)local_94 * 4) != local_94) {
        __assert_fail("native_error_types[i] == static_cast<native_error_type>(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x298,"void mjs::global_object_impl::popuplate_global()");
      }
      puVar1 = &eo.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_;
      std::__cxx11::wostringstream::wostringstream((wostringstream *)puVar1);
      mjs::operator<<((wostream *)puVar1,local_94);
      std::__cxx11::wostringstream::str();
      auVar9 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                         ((wstring *)
                          &prototype.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                           super_gc_heap_ptr_untyped.pos_);
      local_248 = auVar9;
      (**(this->super_global_object).super_object._vptr_object)(local_238,this,local_248);
      std::__cxx11::wstring::~wstring
                ((wstring *)
                 &prototype.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
      bVar2 = is_function((value *)local_238);
      if (!bVar2) {
        __assert_fail("is_function(eo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29c,"void mjs::global_object_impl::popuplate_global()");
      }
      poVar7 = value::object_value((value *)local_238);
      poVar8 = gc_heap_ptr<mjs::object>::operator->(poVar7);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_2a0,L"prototype");
      (**poVar8->_vptr_object)(local_290,poVar8,&local_2a0);
      vVar4 = value::type((value *)local_290);
      if (vVar4 != object) {
        __assert_fail("prototype.type() == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29e,"void mjs::global_object_impl::popuplate_global()");
      }
      poVar7 = value::object_value((value *)local_290);
      gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&local_2a4,poVar7);
      this->error_prototype_[local_94].pos_ = local_2a4.pos_;
      value::~value((value *)local_290);
      value::~value((value *)local_238);
      std::__cxx11::wostringstream::~wostringstream
                ((wostringstream *)
                 &eo.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
    }
  }
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_2e0,L"Object");
  (**(this->super_global_object).super_object._vptr_object)(&local_2d0,this,&local_2e0);
  poVar7 = value::object_value(&local_2d0);
  poVar8 = gc_heap_ptr<mjs::object>::operator->(poVar7);
  puVar1 = &self.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)puVar1,L"prototype");
  bVar2 = object::can_put(poVar8,(wstring_view *)puVar1);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    value::~value(&local_2d0);
    self_ptr((global_object_impl *)local_300);
    local_304 = dont_enum;
    if (0 < (int)(this->super_global_object).version_) {
      operator|=(&local_304,dont_delete);
    }
    if (1 < (int)(this->super_global_object).version_) {
      operator|=(&local_304,read_only);
    }
    pgVar6 = object::heap((object *)this);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328,"NaN");
    string::string(&local_318,pgVar6,&local_328);
    value::value(&local_350,NAN);
    (*(this->super_global_object).super_object._vptr_object[1])
              (this,&local_318,&local_350,(ulong)local_304);
    value::~value(&local_350);
    string::~string(&local_318);
    pgVar6 = object::heap((object *)this);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,"Infinity");
    string::string(&local_360,pgVar6,&local_370);
    value::value(&local_398,INFINITY);
    (*(this->super_global_object).super_object._vptr_object[1])
              (this,&local_360,&local_398,(ulong)local_304);
    value::~value(&local_398);
    string::~string(&local_360);
    pgVar6 = object::heap((object *)this);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8,"undefined")
    ;
    string::string(&local_3a8,pgVar6,&local_3b8);
    value::value(&local_3e0,(value *)value::undefined);
    (*(this->super_global_object).super_object._vptr_object[1])
              (this,&local_3a8,&local_3e0,(ulong)local_304);
    value::~value(&local_3e0);
    string::~string(&local_3a8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_3f0,(gc_heap_ptr<mjs::global_object> *)local_300);
    local_400.h = object::heap((object *)this);
    local_400.ver = (this->super_global_object).version_;
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
              ((gc_heap_ptr<mjs::global_object> *)local_300,&local_3f0,"parseInt",&local_400,2);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_3f0);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_410,(gc_heap_ptr<mjs::global_object> *)local_300);
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
              ((gc_heap_ptr<mjs::global_object> *)local_300,&local_410,"isNaN",&local_411,1);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_410);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_428,(gc_heap_ptr<mjs::global_object> *)local_300);
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_3_>
              ((gc_heap_ptr<mjs::global_object> *)local_300,&local_428,"isFinite",&local_429,1);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_428);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_440,(gc_heap_ptr<mjs::global_object> *)local_300);
    put_string_function.self = (gc_heap_ptr<mjs::global_object> *)object::heap((object *)this);
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_4_>
              ((gc_heap_ptr<mjs::global_object> *)local_300,&local_440,"alert",
               (anon_class_8_1_54a39808_for_f *)&put_string_function,1);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_440);
    throw_func.super_gc_heap_ptr_untyped._8_8_ = local_300;
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&throw_func.super_gc_heap_ptr_untyped.pos_,"parseFloat",anon_unknown_35::parse_float)
    ;
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&throw_func.super_gc_heap_ptr_untyped.pos_,"escape",anon_unknown_35::escape);
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&throw_func.super_gc_heap_ptr_untyped.pos_,"unescape",anon_unknown_35::unescape);
    if (0 < (int)(this->super_global_object).version_) {
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&throw_func.super_gc_heap_ptr_untyped.pos_,"encodeURI",anon_unknown_35::encode_uri)
      ;
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&throw_func.super_gc_heap_ptr_untyped.pos_,"encodeURIComponent",
                 anon_unknown_35::encode_uri_component);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&throw_func.super_gc_heap_ptr_untyped.pos_,"decodeURI",anon_unknown_35::decode_uri)
      ;
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&throw_func.super_gc_heap_ptr_untyped.pos_,"decodeURIComponent",
                 anon_unknown_35::decode_uri_component);
    }
    if (1 < (int)(this->super_global_object).version_) {
      gc_heap_ptr<mjs::global_object>::gc_heap_ptr
                (&local_470.global,(gc_heap_ptr<mjs::global_object> *)local_300);
      (*(this->super_global_object).super_object._vptr_object[0x13])(&local_480,this,"");
      name = string::unsafe_raw_get(&local_480);
      make_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_5_>
                ((mjs *)local_460,(gc_heap_ptr<mjs::global_object> *)local_300,&local_470,name,0);
      string::~string(&local_480);
      popuplate_global()::
      {lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#5}::
      ~vector((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___5_
               *)&local_470);
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
                (&local_4d0,(gc_heap_ptr<mjs::function_object> *)local_460);
      value::value(&local_4c0,&local_4d0);
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
                (&local_508,(gc_heap_ptr<mjs::function_object> *)local_460);
      value::value(&local_4f8,&local_508);
      make_accessor_object
                ((mjs *)&local_498,(gc_heap_ptr<mjs::global_object> *)local_300,&local_4c0,
                 &local_4f8);
      gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&local_484,&local_498);
      (this->thrower_).pos_ = local_484.pos_;
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_498);
      value::~value(&local_4f8);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_508);
      value::~value(&local_4c0);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_4d0);
      gc_heap_ptr<mjs::function_object>::~gc_heap_ptr
                ((gc_heap_ptr<mjs::function_object> *)local_460);
    }
    (*(this->super_global_object).super_object._vptr_object[0x13])(&local_518,this,"global");
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_550,(gc_heap_ptr<mjs::global_object> *)local_300);
    value::value(&local_540,&local_550);
    pVar5 = operator|(dont_delete,read_only);
    (*(this->super_global_object).super_object._vptr_object[1])
              (this,&local_518,&local_540,(ulong)pVar5);
    value::~value(&local_540);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_550);
    string::~string(&local_518);
    (*(this->super_global_object).super_object._vptr_object[0x13])(&local_560,this,"this");
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
              (&local_598,(gc_heap_ptr<mjs::global_object> *)local_300);
    value::value(&local_588,&local_598);
    (*(this->super_global_object).super_object._vptr_object[1])(this,&local_560,&local_588,7);
    value::~value(&local_588);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_598);
    string::~string(&local_560);
    (*(this->super_global_object).super_object._vptr_object[0x13])(&local_5a8,this,"length");
    value::value(&local_5d0,0.0);
    (*(this->super_global_object).super_object._vptr_object[1])(this,&local_5a8,&local_5d0,7);
    value::~value(&local_5d0);
    string::~string(&local_5a8);
    gc_heap_ptr<mjs::global_object>::~gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_300);
    return;
  }
  __assert_fail("!get(L\"Object\").object_value()->can_put(L\"prototype\")",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0x2a3,"void mjs::global_object_impl::popuplate_global()");
}

Assistant:

void popuplate_global() {
        // The object and function prototypes are special
        object_prototype_   = prototype(); // This way the global object will have the same functions as a normal object
        function_prototype_ = static_cast<object_ptr>(heap().make<function_object>(self_ptr(), common_string("Function"), object_prototype()));
         
        auto add = [&](const char* name, auto create_func, gc_heap_ptr_untracked<object>* prototype = nullptr) {
            auto res = create_func(self_ptr());
            put(common_string(name), value{res.obj}, default_attributes);
            if (res.prototype) {
                assert(res.obj.template has_type<function_object>());
                auto& f = static_cast<function_object&>(*res.obj);
                f.put_prototype_with_attributes(res.prototype, prototype_attributes);
            }
            if (prototype) {
                assert(res.prototype);
                *prototype = res.prototype;
            }
        };

        // §15.1
        add("Object", make_object_object, &object_prototype_);          // Resetting it..
        add("Function", make_function_object, &function_prototype_);    // same
        add("Array", make_array_object, &array_prototype_);
        add("String", make_string_object, &string_prototype_);
        add("Boolean", make_boolean_object, &boolean_prototype_);
        add("Number", make_number_object, &number_prototype_);
        add("Math", make_math_object);
        add("Date", make_date_object);
        add("console", make_console_object);
        if (version_ >= version::es5) {
            add("JSON", make_json_object);
        }

        if (language_version() >= version::es3) {
            add("RegExp", make_regexp_object, &regexp_prototype_);
            add("Error", make_error_object);

            // Grab error protototypes before the user can corrupt them
            for (uint32_t i = 0; i < num_native_error_types; ++i) {
                assert(native_error_types[i] == static_cast<native_error_type>(i));
                std::wostringstream woss;
                woss << static_cast<native_error_type>(i);
                auto eo = get(woss.str());
                assert(is_function(eo));
                auto prototype = eo.object_value()->get(L"prototype");
                assert(prototype.type() == value_type::object);
                error_prototype_[i] = prototype.object_value();
            }
        }

        assert(!get(L"Object").object_value()->can_put(L"prototype"));

        auto self = self_ptr();

        auto global_const_attrs = default_attributes;
        if (version_ >= version::es3) {
            global_const_attrs |= property_attribute::dont_delete;
        }
        if (version_ >= version::es5) {
            global_const_attrs |= property_attribute::read_only;
        }

        put(string{heap(), "NaN"}, value{NAN}, global_const_attrs);
        put(string{heap(), "Infinity"}, value{INFINITY}, global_const_attrs);
        put(string{heap(), "undefined"}, value{value::undefined}, global_const_attrs);

        // Note: eval is added by the interpreter

        put_native_function(self, self, "parseInt", [&h=heap(), ver=version_](const value&, const std::vector<value>& args) {
            const auto input = to_string(h, get_arg(args, 0));
            int radix = to_int32(get_arg(args, 1));
            return value{parse_int(input.view(), radix, ver)};
        }, 2);
        put_native_function(self, self, "isNaN", [](const value&, const std::vector<value>& args) {
            return value(std::isnan(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "isFinite", [](const value&, const std::vector<value>& args) {
            return value(std::isfinite(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "alert", [&h=heap()](const value&, const std::vector<value>& args) {
            std::wcout << "ALERT";
            for (auto& a: args) {
                std::wcout << "\t" << to_string(h, a);
            }
            std::wcout << "\n";
            return value::undefined;
        }, 1);

        auto put_string_function = [&](const char* name, auto f) {
            put_native_function(self, self, name, [self, f](const value&, const std::vector<value>& args) {
                const auto input = to_string(self.heap(), get_arg(args, 0));
                return f(self, input.view());
            }, 1);
        };

        put_string_function("parseFloat", &parse_float);
        put_string_function("escape", &escape);
        put_string_function("unescape", &unescape);

        if (version_ >= version::es3) {
            put_string_function("encodeURI", &encode_uri);
            put_string_function("encodeURIComponent", &encode_uri_component);
            put_string_function("decodeURI", &decode_uri);
            put_string_function("decodeURIComponent", &decode_uri_component);
        }

        if (version_ >= version::es5) {
            // ES5.1, 13.2.3 [[ThrowTypeError]]
            auto throw_func = make_function(self, [global = self](const value&, const std::vector<value>&) -> value {
                // For now only strict mode code uses this...
                throw native_error_exception{native_error_type::type, global->stack_trace(), "Property may not be accessed in strict mode"};
            }, common_string("").unsafe_raw_get(), 0);
            thrower_ = make_accessor_object(self, value{throw_func}, value{throw_func});

        }

        // Add this class as the global object
        put(common_string("global"), value{self}, property_attribute::dont_delete | property_attribute::read_only);

        put(common_string("this"), value{self}, prototype_attributes);

        // Make ES5 Conformance Suite happy
        put(common_string("length"), value{0.}, prototype_attributes);
    }